

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition.c
# Opt level: O2

void delete_data_dictionary(coda_data_dictionary *data_dictionary)

{
  long lVar1;
  
  if (data_dictionary->hash_data != (hashtable *)0x0) {
    coda_hashtable_delete(data_dictionary->hash_data);
  }
  if (data_dictionary->product_class != (coda_product_class **)0x0) {
    for (lVar1 = 0; lVar1 < data_dictionary->num_product_classes; lVar1 = lVar1 + 1) {
      coda_product_class_delete(data_dictionary->product_class[lVar1]);
    }
    free(data_dictionary->product_class);
  }
  for (lVar1 = 3; lVar1 != 0xd; lVar1 = lVar1 + 1) {
    if (data_dictionary->detection_tree[lVar1 + -3] != (coda_detection_node *)0x0) {
      coda_detection_tree_delete(data_dictionary->detection_tree[lVar1 + -3]);
    }
  }
  free(data_dictionary);
  return;
}

Assistant:

static void delete_data_dictionary(coda_data_dictionary *data_dictionary)
{
    int i;

    assert(data_dictionary != NULL);
    if (data_dictionary->hash_data != NULL)
    {
        hashtable_delete(data_dictionary->hash_data);
    }
    if (data_dictionary->product_class != NULL)
    {
        for (i = 0; i < data_dictionary->num_product_classes; i++)
        {
            coda_product_class_delete(data_dictionary->product_class[i]);
        }
        free(data_dictionary->product_class);
    }
    for (i = 0; i < CODA_NUM_FORMATS; i++)
    {
        if (data_dictionary->detection_tree[i] != NULL)
        {
            coda_detection_tree_delete(data_dictionary->detection_tree[i]);
        }
    }

    free(data_dictionary);
}